

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

BIGNUM * BN_dup(BIGNUM *a)

{
  BIGNUM *a_00;
  BIGNUM *pBVar1;
  
  if (a != (BIGNUM *)0x0) {
    if ((a->flags & 8) == 0) {
      a_00 = BN_new();
    }
    else {
      a_00 = (BIGNUM *)BN_secure_new();
    }
    if (a_00 != (BIGNUM *)0x0) {
      pBVar1 = BN_copy(a_00,a);
      if (pBVar1 != (BIGNUM *)0x0) {
        return a_00;
      }
      BN_free(a_00);
    }
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_dup(const BIGNUM *a)
{
    BIGNUM *t;

    if (a == NULL)
        return NULL;
    bn_check_top(a);

    t = BN_get_flags(a, BN_FLG_SECURE) ? BN_secure_new() : BN_new();
    if (t == NULL)
        return NULL;
    if (!BN_copy(t, a)) {
        BN_free(t);
        return NULL;
    }
    bn_check_top(t);
    return t;
}